

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O0

unique_ptr<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
 HawkTracer::parser::make_unique<HawkTracer::client::CallgrindConverter>(void)

{
  CallgrindConverter *this;
  __uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
  in_RDI;
  
  this = (CallgrindConverter *)operator_new(0xb0);
  (this->_events)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_events)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_events)._M_h._M_element_count = 0;
  *(undefined8 *)&(this->_events)._M_h._M_rehash_policy = 0;
  (this->_events)._M_h._M_bucket_count = 0;
  (this->_events)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  *(undefined8 *)&this->field_0x70 = 0;
  (this->_events)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x50 = 0;
  *(undefined8 *)&this->_file_name = 0;
  *(undefined8 *)&this->field_0x40 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  *(undefined8 *)&(this->super_Converter)._mapping_klass_id = 0;
  *(undefined8 *)&this->_callgrind_header = 0;
  *(undefined8 *)&(this->super_Converter).field_0x20 = 0;
  *(undefined8 *)&(this->super_Converter).field_0x28 = 0;
  *(undefined8 *)&(this->super_Converter)._mapping_klass_name = 0;
  *(undefined8 *)&(this->super_Converter).field_0x18 = 0;
  (this->super_Converter)._vptr_Converter = (_func_int **)0x0;
  (this->super_Converter)._tracepoint_map._M_t.
  super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
  .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>._M_head_impl =
       (TracepointMap *)0x0;
  client::CallgrindConverter::CallgrindConverter(this);
  std::
  unique_ptr<HawkTracer::client::CallgrindConverter,std::default_delete<HawkTracer::client::CallgrindConverter>>
  ::unique_ptr<std::default_delete<HawkTracer::client::CallgrindConverter>,void>
            ((unique_ptr<HawkTracer::client::CallgrindConverter,std::default_delete<HawkTracer::client::CallgrindConverter>>
              *)in_RDI.
                super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
                ._M_t.
                super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
                .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl
             ,this);
  return (__uniq_ptr_data<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>,_true,_true>
          )(tuple<HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
            )in_RDI.
             super___uniq_ptr_impl<HawkTracer::client::CallgrindConverter,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             ._M_t.
             super__Tuple_impl<0UL,_HawkTracer::client::CallgrindConverter_*,_std::default_delete<HawkTracer::client::CallgrindConverter>_>
             .super__Head_base<0UL,_HawkTracer::client::CallgrindConverter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}